

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_test.cc
# Opt level: O0

void __thiscall
JsonTest_DecodeFloats_Test::~JsonTest_DecodeFloats_Test(JsonTest_DecodeFloats_Test *this)

{
  JsonTest_DecodeFloats_Test *this_local;
  
  ~JsonTest_DecodeFloats_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JsonTest, DecodeFloats) {
  upb::Arena a;

  for (const auto& test : FloatTestsPass) {
    upb_test_Box* box = JsonDecode(test.json.c_str(), a.ptr());
    EXPECT_NE(box, nullptr);
    float f = upb_test_Box_f(box);
    EXPECT_EQ(f, test.f);
  }

  for (const auto& test : FloatTestsFail) {
    upb_test_Box* box = JsonDecode(test.json.c_str(), a.ptr());
    EXPECT_EQ(box, nullptr);
  }
}